

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

void tinyobj::InitTexOpt(texture_option_t *texopt,bool is_bump)

{
  texopt->imfchan = is_bump ^ 0x6d;
  texopt->bump_multiplier = 1.0;
  texopt->clamp = false;
  texopt->blendu = true;
  texopt->blendv = true;
  texopt->sharpness = 1.0;
  texopt->brightness = 0.0;
  texopt->contrast = 1.0;
  texopt->origin_offset[0] = 0.0;
  texopt->origin_offset[1] = 0.0;
  texopt->origin_offset[2] = 0.0;
  texopt->scale[0] = 1.0;
  texopt->scale[1] = 1.0;
  *(undefined8 *)(texopt->scale + 2) = 0x3f800000;
  texopt->turbulence[1] = 0.0;
  texopt->turbulence[2] = 0.0;
  texopt->type = TEXTURE_TYPE_NONE;
  return;
}

Assistant:

static void InitTexOpt(texture_option_t *texopt, const bool is_bump) {
  if (is_bump) {
    texopt->imfchan = 'l';
  } else {
    texopt->imfchan = 'm';
  }
  texopt->bump_multiplier = static_cast<real_t>(1.0);
  texopt->clamp = false;
  texopt->blendu = true;
  texopt->blendv = true;
  texopt->sharpness = static_cast<real_t>(1.0);
  texopt->brightness = static_cast<real_t>(0.0);
  texopt->contrast = static_cast<real_t>(1.0);
  texopt->origin_offset[0] = static_cast<real_t>(0.0);
  texopt->origin_offset[1] = static_cast<real_t>(0.0);
  texopt->origin_offset[2] = static_cast<real_t>(0.0);
  texopt->scale[0] = static_cast<real_t>(1.0);
  texopt->scale[1] = static_cast<real_t>(1.0);
  texopt->scale[2] = static_cast<real_t>(1.0);
  texopt->turbulence[0] = static_cast<real_t>(0.0);
  texopt->turbulence[1] = static_cast<real_t>(0.0);
  texopt->turbulence[2] = static_cast<real_t>(0.0);
  texopt->type = TEXTURE_TYPE_NONE;
}